

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfswindow.cpp
# Opt level: O0

void __thiscall QEglFSWindow::requestActivateWindow(QEglFSWindow *this)

{
  int iVar1;
  QOpenGLCompositorWindow *pQVar2;
  QPoint *atopLeft;
  long in_FS_OFFSET;
  QWindow *wnd;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  QRect *in_stack_ffffffffffffffa0;
  QRegion *this_00;
  QPoint local_28;
  undefined1 local_20 [16];
  QRegion local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformWindow::window();
  iVar1 = QWindow::type();
  if (iVar1 != 0x11) {
    pQVar2 = (QOpenGLCompositorWindow *)QOpenGLCompositor::instance();
    QOpenGLCompositor::moveToTop(pQVar2);
  }
  atopLeft = (QPoint *)QPlatformWindow::window();
  QWindowSystemInterface::handleFocusWindowChanged<QWindowSystemInterface::DefaultDelivery>
            ((QWindow *)atopLeft,ActiveWindowFocusReason);
  uVar3 = 0;
  QPoint::QPoint(&local_28,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  QWindow::geometry();
  QRect::size((QRect *)CONCAT44(uVar3,in_stack_ffffffffffffff90));
  QRect::QRect(in_stack_ffffffffffffffa0,atopLeft,(QSize *)CONCAT44(uVar3,in_stack_ffffffffffffff90)
              );
  this_00 = local_10;
  QRegion::QRegion(this_00,local_20,uVar3);
  QWindowSystemInterface::handleExposeEvent<QWindowSystemInterface::DefaultDelivery>
            ((QWindow *)atopLeft,this_00);
  QRegion::~QRegion(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSWindow::requestActivateWindow()
{
#ifndef QT_NO_OPENGL
    if (window()->type() != Qt::Desktop)
        QOpenGLCompositor::instance()->moveToTop(this);
#endif
    QWindow *wnd = window();
    QWindowSystemInterface::handleFocusWindowChanged(wnd, Qt::ActiveWindowFocusReason);
    QWindowSystemInterface::handleExposeEvent(wnd, QRect(QPoint(0, 0), wnd->geometry().size()));
}